

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O3

void av1_noise_estimate_init(NOISE_ESTIMATE *ne,int width,int height)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  
  lVar1 = (long)height * (long)width;
  ne->enabled = 0;
  uVar2 = 0x8c;
  if (0x1fa3ff < lVar1) {
    uVar2 = 200;
  }
  ne->level = (uint)(0xe0fff < lVar1);
  ne->value = 0;
  ne->thresh = 0x5a;
  ne->count = 0;
  ne->last_w = 0;
  ne->last_h = 0;
  if (lVar1 < 0xe1000) {
    uVar3 = 0x5a;
    uVar2 = 0x73;
    if (lVar1 < 0x38400) goto LAB_0024e64a;
  }
  ne->thresh = uVar2;
  uVar3 = (ulong)uVar2;
LAB_0024e64a:
  ne->num_frames_estimate = 0xf;
  ne->adapt_thresh = (int)(uVar3 >> 1) + (int)uVar3;
  return;
}

Assistant:

void av1_noise_estimate_init(NOISE_ESTIMATE *const ne, int width, int height) {
  const int64_t area = (int64_t)width * height;
  ne->enabled = 0;
  ne->level = (area < 1280 * 720) ? kLowLow : kLow;
  ne->value = 0;
  ne->count = 0;
  ne->thresh = 90;
  ne->last_w = 0;
  ne->last_h = 0;
  if (area >= 1920 * 1080) {
    ne->thresh = 200;
  } else if (area >= 1280 * 720) {
    ne->thresh = 140;
  } else if (area >= 640 * 360) {
    ne->thresh = 115;
  }
  ne->num_frames_estimate = 15;
  ne->adapt_thresh = (3 * ne->thresh) >> 1;
}